

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurayHelper.cpp
# Opt level: O0

NavigationCommand
anon_unknown.dwarf_3633c::makeDefaultTrackCommand
          (int audioTrackIdx,int subTrackIdx,SubTrackMode subTrackMode)

{
  uint16_t uVar1;
  pointer pvVar2;
  byte *pbVar3;
  NavigationCommand NVar4;
  SubTrackMode subTrackMode_local;
  int subTrackIdx_local;
  int audioTrackIdx_local;
  NavigationCommand cmd;
  undefined1 auVar5 [11];
  undefined4 uVar6;
  
  subTrackIdx_local._0_1_ = 'Q';
  subTrackIdx_local._1_1_ = 0xc0;
  subTrackIdx_local._2_1_ = '\0';
  subTrackIdx_local._3_1_ = '\x01';
  audioTrackIdx_local._0_1_ = '\0';
  audioTrackIdx_local._1_1_ = '\0';
  audioTrackIdx_local._2_1_ = '\0';
  audioTrackIdx_local._3_1_ = '\0';
  cmd._M_elems[0] = '\0';
  cmd._M_elems[1] = '\0';
  cmd._M_elems[2] = '\0';
  cmd._M_elems[3] = '\0';
  if (-1 < audioTrackIdx) {
    uVar1 = my_ntohs((short)audioTrackIdx + 1);
    pvVar2 = std::array<unsigned_char,_12UL>::data((array<unsigned_char,_12UL> *)&subTrackIdx_local)
    ;
    *(uint *)(pvVar2 + 4) = (uint)uVar1;
    pbVar3 = std::array<unsigned_char,_12UL>::operator[]
                       ((array<unsigned_char,_12UL> *)&subTrackIdx_local,4);
    *pbVar3 = *pbVar3 & 0xf;
    pbVar3 = std::array<unsigned_char,_12UL>::operator[]
                       ((array<unsigned_char,_12UL> *)&subTrackIdx_local,4);
    *pbVar3 = *pbVar3 | 0x80;
  }
  if (-1 < subTrackIdx) {
    uVar1 = my_ntohs((short)subTrackIdx + 1);
    pvVar2 = std::array<unsigned_char,_12UL>::data((array<unsigned_char,_12UL> *)&subTrackIdx_local)
    ;
    *(uint *)(pvVar2 + 6) = (uint)uVar1;
    pbVar3 = std::array<unsigned_char,_12UL>::operator[]
                       ((array<unsigned_char,_12UL> *)&subTrackIdx_local,6);
    *pbVar3 = *pbVar3 & 0xf;
    pbVar3 = std::array<unsigned_char,_12UL>::operator[]
                       ((array<unsigned_char,_12UL> *)&subTrackIdx_local,6);
    *pbVar3 = *pbVar3 | 0x80;
  }
  if (subTrackMode == All) {
    pbVar3 = std::array<unsigned_char,_12UL>::operator[]
                       ((array<unsigned_char,_12UL> *)&subTrackIdx_local,6);
    *pbVar3 = *pbVar3 | 0x40;
  }
  NVar4._M_elems[0] = (uchar)subTrackIdx_local;
  auVar5[1] = subTrackIdx_local._1_1_;
  auVar5[2] = subTrackIdx_local._2_1_;
  auVar5[3] = subTrackIdx_local._3_1_;
  auVar5[4] = (uchar)audioTrackIdx_local;
  auVar5[5] = audioTrackIdx_local._1_1_;
  auVar5[6] = audioTrackIdx_local._2_1_;
  auVar5[7] = audioTrackIdx_local._3_1_;
  register0x00000010 = cmd._M_elems[0];
  register0x00000011 = cmd._M_elems[1];
  register0x00000012 = cmd._M_elems[2];
  register0x00000013 = cmd._M_elems[3];
  return (NavigationCommand)NVar4._M_elems;
}

Assistant:

NavigationCommand makeDefaultTrackCommand(int audioTrackIdx, int subTrackIdx,
                                          const MuxerManager::SubTrackMode subTrackMode)
{
    NavigationCommand cmd = {0x51, 0xC0, 0x00, 0x01, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00};
    if (audioTrackIdx >= 0)
    {
        ++audioTrackIdx;  // stream indices in this command are 1-based.
        audioTrackIdx = my_ntohs(static_cast<std::uint16_t>(audioTrackIdx));
        memcpy(cmd.data() + 4, &audioTrackIdx, sizeof(audioTrackIdx));
        cmd[4] &= 0x0f;
        cmd[4] |= 0x80;
    }
    if (subTrackIdx >= 0)
    {
        ++subTrackIdx;
        subTrackIdx = my_ntohs(static_cast<std::uint16_t>(subTrackIdx));
        memcpy(cmd.data() + 6, &subTrackIdx, sizeof(subTrackIdx));
        cmd[6] &= 0x0f;
        cmd[6] |= 0x80;
    }
    if (subTrackMode == MuxerManager::SubTrackMode::All)
    {
        cmd[6] |= 0x40;
    }
    return cmd;
}